

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reader_suite.cpp
# Opt level: O3

void basic_suite::test_string_allocator(void)

{
  bool bVar1;
  char input [8];
  reader reader;
  uint local_18c;
  basic_string<char,_std::char_traits<char>,_std::scoped_allocator_adaptor<std::allocator<char>_>_>
  local_188;
  char local_160 [8];
  basic_reader<char> local_158;
  
  builtin_strncpy(local_160,"\"alpha\"",8);
  local_188._M_dataplus._0_8_ = strlen(local_160);
  local_188._M_dataplus._M_p = local_160;
  trial::protocol::json::basic_reader<char>::basic_reader(&local_158,(view_type *)&local_188);
  local_18c = 10;
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,trial::protocol::json::token::code::value,trial::protocol::json::token::code::value>
            ("reader.code()","token::code::string",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/reader_suite.cpp"
             ,0xbc,"void basic_suite::test_string_allocator()",&local_188,&local_18c);
  local_188._M_dataplus._0_4_ = trial::protocol::json::basic_reader<char>::symbol(&local_158);
  local_18c = 6;
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,trial::protocol::json::token::symbol::value,trial::protocol::json::token::symbol::value>
            ("reader.symbol()","token::symbol::string",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/reader_suite.cpp"
             ,0xbd,"void basic_suite::test_string_allocator()",&local_188,&local_18c);
  local_188._M_dataplus._0_4_ = 0;
  if ((uint)(local_158.decoder.current.code + error_unbalanced_end_array) < 0xb) {
    local_188._M_dataplus._0_4_ =
         *(undefined4 *)
          (&DAT_0011f510 +
          (ulong)(uint)(local_158.decoder.current.code + error_unbalanced_end_array) * 4);
  }
  local_18c = 2;
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,trial::protocol::json::token::category::value,trial::protocol::json::token::category::value>
            ("reader.category()","token::category::data",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/reader_suite.cpp"
             ,0xbe,"void basic_suite::test_string_allocator()",&local_188,&local_18c);
  trial::protocol::json::basic_reader<char>::
  value<std::__cxx11::basic_string<char,std::char_traits<char>,std::scoped_allocator_adaptor<std::allocator<char>>>>
            (&local_188,&local_158);
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,std::__cxx11::basic_string<char,std::char_traits<char>,std::scoped_allocator_adaptor<std::allocator<char>>>,char[6]>
            ("reader.value<string_type>()","\"alpha\"",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/reader_suite.cpp"
             ,0xc0,"void basic_suite::test_string_allocator()",&local_188,"alpha");
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::scoped_allocator_adaptor<std::allocator<char>_>_>_11
       *)local_188._M_dataplus._M_p != &local_188.field_2) {
    operator_delete(local_188._M_dataplus._M_p,local_188.field_2._M_allocated_capacity + 1);
  }
  local_188._M_dataplus._0_8_ =
       (long)local_158.decoder.current.view.tail - (long)local_158.decoder.current.view.head;
  local_188._M_dataplus._M_p = local_158.decoder.current.view.head;
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,std::basic_string_view<char,std::char_traits<char>>,char[8]>
            ("reader.literal()","\"\\\"alpha\\\"\"",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/reader_suite.cpp"
             ,0xc1,"void basic_suite::test_string_allocator()",&local_188,"\"alpha\"");
  bVar1 = trial::protocol::json::basic_reader<char>::next(&local_158);
  local_188._M_dataplus._0_1_ = bVar1;
  local_18c = local_18c & 0xffffff00;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("reader.next()","false",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/reader_suite.cpp"
             ,0xc2,"void basic_suite::test_string_allocator()",&local_188,&local_18c);
  if (local_158.stack.c.
      super__Vector_base<trial::protocol::json::basic_reader<char>::frame,_std::allocator<trial::protocol::json::basic_reader<char>::frame>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_158.stack.c.
                    super__Vector_base<trial::protocol::json::basic_reader<char>::frame,_std::allocator<trial::protocol::json::basic_reader<char>::frame>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_158.stack.c.
                          super__Vector_base<trial::protocol::json::basic_reader<char>::frame,_std::allocator<trial::protocol::json::basic_reader<char>::frame>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_158.stack.c.
                          super__Vector_base<trial::protocol::json::basic_reader<char>::frame,_std::allocator<trial::protocol::json::basic_reader<char>::frame>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void test_string_allocator()
{
    const char input[] = "\"alpha\"";
    json::reader reader(input);
    TRIAL_PROTOCOL_TEST_EQUAL(reader.code(), token::code::string);
    TRIAL_PROTOCOL_TEST_EQUAL(reader.symbol(), token::symbol::string);
    TRIAL_PROTOCOL_TEST_EQUAL(reader.category(), token::category::data);
    using string_type = std::basic_string<char, std::char_traits<char>, std::scoped_allocator_adaptor<std::allocator<char>>>;
    TRIAL_PROTOCOL_TEST_EQUAL(reader.value<string_type>(), "alpha");
    TRIAL_PROTOCOL_TEST_EQUAL(reader.literal(), "\"alpha\"");
    TRIAL_PROTOCOL_TEST_EQUAL(reader.next(), false);
}